

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O2

compile_errcode __thiscall OutputStatement::Action(OutputStatement *this)

{
  SymbolName SVar1;
  compile_errcode cVar2;
  undefined4 uVar3;
  allocator local_55;
  SymbolType expression_type;
  string str;
  
  uVar3 = 0;
LAB_00139219:
  do {
    SVar1 = SymbolQueue::GetCurrentName(handle_correct_queue);
    switch(uVar3) {
    case 0:
      uVar3 = 1;
      if (SVar1 != PRINTF_SYM) {
        return -1;
      }
      break;
    case 1:
      uVar3 = 2;
      if (SVar1 != L_CIRCLE_BRACKET_SYM) {
        return -1;
      }
      break;
    case 2:
      if (SVar1 != STRING_SYM) goto switchD_00139235_caseD_4;
      std::__cxx11::string::string((string *)&str,"This is a string",&local_55);
      std::__cxx11::string::~string((string *)&str);
      uVar3 = 3;
      break;
    case 3:
      uVar3 = 4;
      if (SVar1 != COMMA_SYM) {
        if (SVar1 != R_CIRCLE_BRACKET_SYM) {
          return -1;
        }
        uVar3 = 6;
      }
      break;
    case 4:
      goto switchD_00139235_caseD_4;
    case 5:
      uVar3 = 6;
      if (SVar1 != R_CIRCLE_BRACKET_SYM) {
        return -1;
      }
      break;
    case 6:
      return 0;
    }
    SymbolQueue::NextSymbol(handle_correct_queue);
  } while( true );
switchD_00139235_caseD_4:
  cVar2 = Expression::Action(&this->m_expression,&expression_type);
  uVar3 = 5;
  if (cVar2 != 0) {
    return -1;
  }
  goto LAB_00139219;
}

Assistant:

compile_errcode OutputStatement::Action() {
    int ret = COMPILE_OK;
    int state = 0;
    SymbolType expression_type;
    while (true) {
        SymbolName name = handle_correct_queue->GetCurrentName();
        switch (state) {
            case 0: {
                if (name == PRINTF_SYM) {
                    state = 1;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 1: {
                if (name == L_CIRCLE_BRACKET_SYM) {
                    state = 2;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 2: {
                if (name == STRING_SYM) {
                    string str("This is a string");
                    state = 3;
                    break;
                } else if ((ret = m_expression.Action(expression_type)) == COMPILE_OK) {
                    state = 5;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 3: {
                if (name == COMMA_SYM) {
                    state = 4;
                    break;
                } else if (name == R_CIRCLE_BRACKET_SYM) {
                    state = 6;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 4: {
                if ((ret = m_expression.Action(expression_type)) == COMPILE_OK) {
                    state = 5;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 5: {
                if (name == R_CIRCLE_BRACKET_SYM) {
                    state = 6;
                    break;
                } else {
                    return NOT_MATCH;
                }
            }
            case 6: return COMPILE_OK;
        }
        if (state != 5)
            handle_correct_queue->NextSymbol();
    }
}